

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O0

void Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::initialize
               (Characteristic characteristic)

{
  invalid_argument *piVar1;
  reference pvVar2;
  uint local_28;
  value_type local_24;
  Element_conflict mult;
  Element_conflict inv;
  Element_conflict i;
  Characteristic characteristic_local;
  
  if (characteristic < 2) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar1,"Characteristic must be strictly positive and a prime number.");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&inverse_,(ulong)characteristic);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&inverse_,0);
  *pvVar2 = 0;
  mult = 1;
  do {
    if (characteristic <= mult) {
      characteristic_ = characteristic;
      return;
    }
    local_24 = 1;
    local_28 = mult;
    while (local_28 % characteristic != 1) {
      local_24 = local_24 + 1;
      if (local_28 == characteristic) {
        piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar1,"Characteristic must be a prime number.");
        __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_28 = local_24 * mult;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&inverse_,(ulong)mult);
    *pvVar2 = local_24;
    mult = mult + 1;
  } while( true );
}

Assistant:

static void initialize(Characteristic characteristic) {
    if (characteristic <= 1)
      throw std::invalid_argument("Characteristic must be strictly positive and a prime number.");

    inverse_.resize(characteristic);
    inverse_[0] = 0;
    for (Element i = 1; i < characteristic; ++i) {
      Element inv = 1;
      Element mult = inv * i;
      while ((mult % characteristic) != 1) {
        ++inv;
        if (mult == characteristic) throw std::invalid_argument("Characteristic must be a prime number.");
        mult = inv * i;
      }
      inverse_[i] = inv;
    }

    characteristic_ = characteristic;
  }